

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O2

void __thiscall
test_matrix_sparse_operator_scalar_division_assignement_Test::
test_matrix_sparse_operator_scalar_division_assignement_Test
          (test_matrix_sparse_operator_scalar_division_assignement_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0017aea0;
  return;
}

Assistant:

TEST(test_matrix_sparse, operator_scalar_division_assignement) {
  Matrix_Sparse matrix({0, 1, 3, 3}, {1, 0, 2}, {3.0, -4.0, 5.0}, 3);
  matrix /= -10.0;

  EXPECT_EQ(matrix.size_row(), 3);
  EXPECT_EQ(matrix.size_column(), 3);
  EXPECT_EQ(matrix.size_non_zero(), 3);
  EXPECT_DOUBLE_EQ(matrix[0][1], -0.30);
  EXPECT_DOUBLE_EQ(matrix[1][0], 0.4);
  EXPECT_DOUBLE_EQ(matrix[1][2], -0.5);
}